

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int fits_unshuffle_8bytes(char *heap,LONGLONG length,int *status)

{
  size_t __size;
  long lVar1;
  long lVar2;
  int extraout_EAX;
  void *__src;
  long lVar3;
  long lVar4;
  
  __size = length * 8;
  __src = malloc(__size);
  if (0 < length) {
    lVar4 = -length;
    lVar3 = 0;
    do {
      lVar1 = lVar3 + (__size - 1);
      *(char *)((long)__src + lVar3 * 8 + (__size - 1)) = heap[lVar3 + (__size - 1)];
      lVar2 = lVar4 + lVar1;
      *(char *)((long)__src + lVar3 * 8 + (__size - 2)) = heap[lVar4 + lVar1];
      lVar1 = lVar4 + lVar2;
      *(char *)((long)__src + lVar3 * 8 + (__size - 3)) = heap[lVar4 + lVar2];
      lVar2 = lVar4 + lVar1;
      *(char *)((long)__src + lVar3 * 8 + (__size - 4)) = heap[lVar4 + lVar1];
      lVar1 = lVar4 + lVar2;
      *(char *)((long)__src + lVar3 * 8 + (__size - 5)) = heap[lVar4 + lVar2];
      lVar2 = lVar4 + lVar1;
      *(char *)((long)__src + lVar3 * 8 + (__size - 6)) = heap[lVar4 + lVar1];
      *(char *)((long)__src + lVar3 * 8 + (__size - 7)) = heap[lVar4 + lVar2];
      *(char *)((long)__src + lVar3 * 8 + (__size - 8)) = heap[length * -2 + lVar2];
      lVar3 = lVar3 + -1;
    } while (-lVar3 != length);
  }
  memcpy(heap,__src,__size);
  free(__src);
  return extraout_EAX;
}

Assistant:

static int fits_unshuffle_8bytes(char *heap, LONGLONG length, int *status)

/* unshuffle the bytes in an array of 8-byte integers or doubles */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 8));
    heapptr = heap + (8 * length) - 1;
    cptr = ptr + (8 * length)  -1;
    
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       cptr--;
       *cptr = *(heapptr - length);
       cptr--;
       *cptr = *(heapptr - (2 * length));
       cptr--;
       *cptr = *(heapptr - (3 * length));
       cptr--;
       *cptr = *(heapptr - (4 * length));
       cptr--;
       *cptr = *(heapptr - (5 * length));
       cptr--;
       *cptr = *(heapptr - (6 * length));
       cptr--;
       *cptr = *(heapptr - (7 * length));
       cptr--;
       heapptr--;
    }
       
    memcpy(heap, ptr, (size_t) (length * 8));
    free(ptr);
    return(*status);
}